

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_instanceof(ExecutionEngine *this)

{
  __type _Var1;
  bool bVar2;
  int iVar3;
  VMStack *this_00;
  Frame *this_01;
  MethodArea *this_02;
  u1 *puVar4;
  cp_info **ppcVar5;
  char *pcVar6;
  ClassFile *pCVar7;
  Value VVar8;
  bool local_19e;
  allocator local_121;
  string local_120 [8];
  string superClassName;
  int local_100;
  allocator local_f9;
  string local_f8 [8];
  string currClassName;
  ClassFile *classFile;
  ClassRuntime *pCStack_c8;
  bool found;
  ClassRuntime *classRuntime;
  ClassInstance *classInstance;
  Object *obj;
  Value resultValue;
  Value objectrefValue;
  allocator local_79;
  string local_78 [8];
  string className;
  char local_58;
  cp_info cpElement;
  cp_info *constantPool;
  u2 cpIndex;
  u1 byte2;
  u1 byte1;
  u1 *code;
  MethodArea *methodArea;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  this_02 = MethodArea::getInstance();
  puVar4 = Frame::getCode(this_01,this_01->pc);
  constantPool._6_2_ = CONCAT11(puVar4[1],puVar4[2]);
  ppcVar5 = Frame::getConstantPool(this_01);
  local_58 = (char)*(undefined8 *)(*ppcVar5 + (int)(constantPool._6_2_ - 1));
  if (local_58 != '\a') {
    __assert_fail("cpElement.tag == CONSTANT_Class",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x11c3,"void ExecutionEngine::i_instanceof()");
  }
  pcVar6 = getFormattedConstant(*ppcVar5,constantPool._6_2_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,pcVar6,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  VVar8 = Frame::popTopOfOperandStack(this_01);
  VVar8.data = VVar8.data;
  resultValue.data.longValue._4_4_ = VVar8.type;
  if (resultValue.data.longValue._4_4_ != 9) {
    __assert_fail("objectrefValue.type == ValueType::REFERENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x11c7,"void ExecutionEngine::i_instanceof()");
  }
  if (VVar8.data == (ClassInstance *)0x0) {
    resultValue.printType = BOOLEAN;
  }
  else {
    iVar3 = (**((Object *)&(VVar8.data.object)->_vptr_Object)->_vptr_Object)();
    if (iVar3 == 0) {
      pCStack_c8 = ClassInstance::getClassRuntime((ClassInstance *)VVar8.data.object);
      bVar2 = false;
      do {
        if (!(bool)(bVar2 ^ 1)) break;
        pCVar7 = ClassRuntime::getClassFile(pCStack_c8);
        pcVar6 = getFormattedConstant(pCVar7->constant_pool,pCVar7->this_class);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f8,pcVar6,&local_f9);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_f8,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_78);
        if (_Var1) {
          bVar2 = true;
LAB_00145e08:
          local_100 = 0;
        }
        else {
          if (pCVar7->super_class != 0) {
            pcVar6 = getFormattedConstant(pCVar7->constant_pool,pCVar7->this_class);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_120,pcVar6,&local_121);
            std::allocator<char>::~allocator((allocator<char> *)&local_121);
            pCStack_c8 = MethodArea::loadClassNamed(this_02,(string *)local_120);
            std::__cxx11::string::~string(local_120);
            goto LAB_00145e08;
          }
          local_100 = 3;
        }
        std::__cxx11::string::~string(local_f8);
      } while (local_100 == 0);
    }
    else {
      iVar3 = (**((Object *)&(VVar8.data.object)->_vptr_Object)->_vptr_Object)();
      if (iVar3 == 1) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_78,"java/lang/String");
        local_19e = true;
        if (!bVar2) {
          local_19e = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_78,"java/lang/Object");
        }
        bVar2 = local_19e != false;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_78,"java/lang/Object");
      }
    }
    resultValue.printType = (ValueType)bVar2;
  }
  VVar8.type = 4;
  VVar8.printType = obj._0_4_;
  VVar8.data.longValue._4_4_ = resultValue.type;
  VVar8.data.returnAddress = resultValue.printType;
  Frame::pushIntoOperandStack(this_01,VVar8);
  this_01->pc = this_01->pc + 3;
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

void ExecutionEngine::i_instanceof() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    MethodArea &methodArea = MethodArea::getInstance();

    u1 *code = topFrame->getCode(topFrame->pc);
    u1 byte1 = code[1];
    u1 byte2 = code[2];
    
    u2 cpIndex = (byte1 << 8) | byte2;
    cp_info *constantPool = *(topFrame->getConstantPool());
    cp_info cpElement = constantPool[cpIndex-1];
    assert(cpElement.tag == CONSTANT_Class);
    string className = getFormattedConstant(constantPool, cpIndex);
    
    Value objectrefValue = topFrame->popTopOfOperandStack();
    assert(objectrefValue.type == ValueType::REFERENCE);
    
    Value resultValue;
    resultValue.type = ValueType::INT;

    if (objectrefValue.data.object == NULL) {
        resultValue.data.intValue = 0;
    } else {
        Object *obj = objectrefValue.data.object;
        
        if (obj->objectType() == ObjectType::CLASS_INSTANCE) {
            ClassInstance *classInstance = (ClassInstance *) obj;
            ClassRuntime *classRuntime = classInstance->getClassRuntime();
            
            bool found = false;
            while (!found) {
                ClassFile *classFile = classRuntime->getClassFile();
                string currClassName = getFormattedConstant(classFile->constant_pool, classFile->this_class);
                
                if (currClassName == className) {
                    found = true;
                } else {
                    if (classFile->super_class == 0) {
                        break;
                    } else {
                        string superClassName = getFormattedConstant(classFile->constant_pool, classFile->this_class);
                        classRuntime = methodArea.loadClassNamed(superClassName);
                    }
                }
            }
            
            resultValue.data.intValue = found ? 1 : 0;
        } else if (obj->objectType() == ObjectType::STRING_INSTANCE) {
            resultValue.data.intValue = (className == "java/lang/String" || className == "java/lang/Object") ? 1 : 0;
        } else {
            if (className == "java/lang/Object") {
                resultValue.data.intValue = 1;
            } else {
                resultValue.data.intValue = 0;
            }
        }
    }
    
    topFrame->pushIntoOperandStack(resultValue);
    
    topFrame->pc += 3;
}